

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverVector.h
# Opt level: O1

void Eigen::internal::triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run
               (long size,float *_lhs,long lhsStride,float *rhs)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong rows;
  ulong uVar13;
  ulong cols;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  ulong uVar23;
  float *pfVar24;
  ulong uVar25;
  long lVar26;
  float fVar27;
  const_blas_data_mapper<float,_long,_0> local_50;
  const_blas_data_mapper<float,_long,_0> local_40;
  
  if (size < 0 && _lhs != (float *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
                 );
  }
  if (0 < size) {
    pfVar21 = _lhs + (size + -1) * lhsStride + size;
    pfVar24 = rhs + size;
    uVar16 = size;
    do {
      cols = 8;
      if ((long)uVar16 < 8) {
        cols = uVar16;
      }
      pfVar18 = pfVar21 + -cols;
      uVar19 = 1;
      if (1 < (long)cols) {
        uVar19 = cols;
      }
      rows = uVar16 - cols;
      pfVar1 = rhs + rows;
      uVar17 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 3);
      uVar13 = 0;
      pfVar22 = pfVar21;
      do {
        uVar14 = ~uVar13;
        uVar25 = uVar16 + uVar14;
        fVar27 = rhs[uVar25];
        if ((fVar27 != 0.0) || (NAN(fVar27))) {
          fVar27 = fVar27 / _lhs[uVar25 * lhsStride + uVar25];
          rhs[uVar25] = fVar27;
          uVar15 = uVar14 + cols;
          if (uVar15 != 0 && SCARRY8(uVar14,cols) == (long)uVar15 < 0) {
            if ((ulong)size <= uVar25) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                            ,0x7a,
                            "Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (((long)(uVar15 | rows) < 0) || ((long)(size - uVar15) < (long)rows)) {
              __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                            ,0x93,
                            "Eigen::Block<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1>, 0, Eigen::OuterStride<>>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            uVar25 = uVar15;
            if ((long)uVar17 < (long)uVar15) {
              uVar25 = uVar17;
            }
            if (((ulong)pfVar1 & 3) != 0) {
              uVar25 = uVar15;
            }
            uVar23 = uVar15 - uVar25;
            uVar14 = uVar23 + 3;
            if (-1 < (long)uVar23) {
              uVar14 = uVar23;
            }
            if (0 < (long)uVar25) {
              uVar20 = 0;
              do {
                pfVar24[uVar20 - cols] = pfVar24[uVar20 - cols] - pfVar18[uVar20] * fVar27;
                uVar20 = uVar20 + 1;
              } while (uVar25 != uVar20);
            }
            lVar26 = (uVar14 & 0xfffffffffffffffc) + uVar25;
            uVar20 = uVar25;
            if (3 < (long)uVar23) {
              do {
                pfVar2 = pfVar18 + uVar20;
                fVar7 = pfVar2[1];
                fVar8 = pfVar2[2];
                fVar9 = pfVar2[3];
                pfVar3 = pfVar24 + (uVar20 - cols);
                fVar10 = pfVar3[1];
                fVar11 = pfVar3[2];
                fVar12 = pfVar3[3];
                pfVar4 = pfVar24 + (uVar20 - cols);
                *pfVar4 = *pfVar3 - *pfVar2 * fVar27;
                pfVar4[1] = fVar10 - fVar7 * fVar27;
                pfVar4[2] = fVar11 - fVar8 * fVar27;
                pfVar4[3] = fVar12 - fVar9 * fVar27;
                uVar20 = uVar20 + 4;
              } while ((long)uVar20 < lVar26);
            }
            if (lVar26 < (long)uVar15) {
              lVar26 = (uVar25 - cols) + (uVar14 & 0xfffffffffffffffc);
              do {
                pfVar24[lVar26] = pfVar24[lVar26] - pfVar22[lVar26] * fVar27;
                lVar5 = uVar13 + lVar26;
                lVar26 = lVar26 + 1;
              } while (lVar5 != -2);
            }
          }
        }
        uVar13 = uVar13 + 1;
        pfVar18 = pfVar18 + -lhsStride;
        pfVar22 = pfVar22 + -lhsStride;
      } while (uVar13 != uVar19);
      if (0 < (long)rows) {
        local_40.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = _lhs + rows * lhsStride
        ;
        local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
        local_50.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = pfVar1;
        local_40.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = lhsStride;
        general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
        ::run(rows,cols,&local_40,&local_50,rhs,1,-1.0);
      }
      pfVar21 = pfVar21 + ~lhsStride * 8;
      pfVar24 = pfVar24 + -8;
      bVar6 = 8 < (long)uVar16;
      uVar16 = uVar16 - 8;
    } while (bVar6);
  }
  return;
}

Assistant:

static void run(Index size, const LhsScalar* _lhs, Index lhsStride, RhsScalar* rhs)
  {
    typedef Map<const Matrix<LhsScalar,Dynamic,Dynamic,ColMajor>, 0, OuterStride<> > LhsMap;
    const LhsMap lhs(_lhs,size,size,OuterStride<>(lhsStride));
    typedef const_blas_data_mapper<LhsScalar,Index,ColMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    typename internal::conditional<Conjugate,
                                   const CwiseUnaryOp<typename internal::scalar_conjugate_op<LhsScalar>,LhsMap>,
                                   const LhsMap&
                                  >::type cjLhs(lhs);
    static const Index PanelWidth = EIGEN_TUNE_TRIANGULAR_PANEL_WIDTH;

    for(Index pi=IsLower ? 0 : size;
        IsLower ? pi<size : pi>0;
        IsLower ? pi+=PanelWidth : pi-=PanelWidth)
    {
      Index actualPanelWidth = (std::min)(IsLower ? size - pi : pi, PanelWidth);
      Index startBlock = IsLower ? pi : pi-actualPanelWidth;
      Index endBlock = IsLower ? pi + actualPanelWidth : 0;

      for(Index k=0; k<actualPanelWidth; ++k)
      {
        Index i = IsLower ? pi+k : pi-k-1;
        if(numext::not_equal_strict(rhs[i],RhsScalar(0)))
        {
          if(!(Mode & UnitDiag))
            rhs[i] /= cjLhs.coeff(i,i);

          Index r = actualPanelWidth - k - 1; // remaining size
          Index s = IsLower ? i+1 : i-r;
          if (r>0)
            Map<Matrix<RhsScalar,Dynamic,1> >(rhs+s,r) -= rhs[i] * cjLhs.col(i).segment(s,r);
        }
      }
      Index r = IsLower ? size - endBlock : startBlock; // remaining size
      if (r > 0)
      {
        // let's directly call the low level product function because:
        // 1 - it is faster to compile
        // 2 - it is slightly faster at runtime
        general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,Conjugate,RhsScalar,RhsMapper,false>::run(
            r, actualPanelWidth,
            LhsMapper(&lhs.coeffRef(endBlock,startBlock), lhsStride),
            RhsMapper(rhs+startBlock, 1),
            rhs+endBlock, 1, RhsScalar(-1));
      }
    }
  }